

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O2

void __thiscall
vk::BinaryRegistryDetail::BinaryRegistryWriter::writeToPath
          (BinaryRegistryWriter *this,string *dstPath)

{
  deUint32 dVar1;
  pointer pBVar2;
  pointer ppSVar3;
  bool bVar4;
  char cVar5;
  deUint32 dVar6;
  Exception *this_00;
  InternalError *this_01;
  deUint32 dVar7;
  SparseIndexNode *pSVar8;
  size_t childNdx;
  ulong uVar9;
  long lVar10;
  _Alloc_hider _Var11;
  long lVar12;
  long lVar13;
  long lVar14;
  pointer pPVar15;
  SparseIndexNode *pSVar16;
  allocator<char> local_2c9;
  string *local_2c8;
  BinaryRegistryWriter *local_2c0;
  UniquePtr<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode,_de::DefaultDeleter<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode>_>
  sparseIndex;
  vector<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
  index;
  string local_270;
  FilePath filePath;
  ofstream out;
  size_type local_228;
  int aiStack_210 [120];
  
  local_2c8 = dstPath;
  local_2c0 = this;
  std::__cxx11::string::string((string *)&out,(string *)dstPath);
  bVar4 = de::FilePath::exists((FilePath *)&out);
  std::__cxx11::string::~string((string *)&out);
  if (!bVar4) {
    de::createDirectoryAndParents((local_2c8->_M_dataplus)._M_p);
  }
  lVar14 = 8;
  for (uVar9 = 0;
      pBVar2 = (local_2c0->m_binaries).
               super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar9 < (ulong)((long)(local_2c0->m_binaries).
                            super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar2 >> 4);
      uVar9 = uVar9 + 1) {
    if (*(long *)((long)&pBVar2->binary + lVar14) == 0) {
      anon_unknown_8::getProgramPath((string *)&out,local_2c8,(deUint32)uVar9);
      std::__cxx11::string::string((string *)&filePath,(string *)&out);
      bVar4 = de::FilePath::exists(&filePath);
      std::__cxx11::string::~string((string *)&filePath);
      if (bVar4) {
        deDeleteFile(_out);
      }
      std::__cxx11::string::~string((string *)&out);
    }
    else {
      lVar12 = *(long *)((long)pBVar2 + lVar14 + -8);
      anon_unknown_8::getProgramPath(&local_270,local_2c8,(deUint32)uVar9);
      std::__cxx11::string::string((string *)&filePath,(string *)&local_270);
      de::FilePath::getDirName_abi_cxx11_((string *)&sparseIndex,&filePath);
      std::__cxx11::string::string((string *)&out,(string *)&sparseIndex);
      bVar4 = de::FilePath::exists((FilePath *)&out);
      std::__cxx11::string::~string((string *)&out);
      std::__cxx11::string::~string((string *)&sparseIndex);
      if (!bVar4) {
        de::FilePath::getDirName_abi_cxx11_((string *)&out,&filePath);
        de::createDirectoryAndParents(_out);
        std::__cxx11::string::~string((string *)&out);
      }
      std::ofstream::ofstream((string *)&out,local_270._M_dataplus._M_p,_S_bin);
      cVar5 = std::__basic_file<char>::is_open();
      if ((cVar5 == '\0') || (*(int *)((long)aiStack_210 + *(long *)(_out + -0x18)) != 0)) {
        this_00 = (Exception *)__cxa_allocate_exception(0x30);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &sparseIndex,"Failed to open ",&local_270);
        tcu::Exception::Exception(this_00,(string *)&sparseIndex);
        __cxa_throw(this_00,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
      }
      lVar10 = *(long *)(lVar12 + 8);
      lVar13 = 0;
      if (*(long *)(lVar12 + 0x10) != lVar10) {
        lVar13 = lVar10;
      }
      std::ostream::write((char *)&out,lVar13);
      std::ofstream::close();
      std::ofstream::~ofstream((string *)&out);
      std::__cxx11::string::~string((string *)&filePath);
      std::__cxx11::string::~string((string *)&local_270);
    }
    lVar14 = lVar14 + 0x10;
  }
  anon_unknown_8::getIndexPath((string *)&out,local_2c8);
  std::__cxx11::string::string((string *)&filePath,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  index.
  super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  index.
  super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  index.
  super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar15 = (local_2c0->m_binaryIndices).
            super__Vector_base<vk::BinaryRegistryDetail::ProgramIdentifierIndex,_std::allocator<vk::BinaryRegistryDetail::ProgramIdentifierIndex>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar12 = 0;
  lVar14 = (long)(local_2c0->m_binaryIndices).
                 super__Vector_base<vk::BinaryRegistryDetail::ProgramIdentifierIndex,_std::allocator<vk::BinaryRegistryDetail::ProgramIdentifierIndex>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar15;
  local_2c0 = (BinaryRegistryWriter *)(pointer)0x0;
  if (lVar14 != 0) {
    local_2c0 = (BinaryRegistryWriter *)pPVar15;
  }
  sparseIndex.
  super_UniqueBase<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode,_de::DefaultDeleter<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode>_>
  .m_data.ptr = (SparseIndexNode *)operator_new(0x20);
  ((sparseIndex.
    super_UniqueBase<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode,_de::DefaultDeleter<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode>_>
    .m_data.ptr)->children).
  super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((sparseIndex.
    super_UniqueBase<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode,_de::DefaultDeleter<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode>_>
    .m_data.ptr)->children).
  super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (sparseIndex.
   super_UniqueBase<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode,_de::DefaultDeleter<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode>_>
   .m_data.ptr)->word = 0;
  (sparseIndex.
   super_UniqueBase<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode,_de::DefaultDeleter<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode>_>
   .m_data.ptr)->index = 0;
  ((sparseIndex.
    super_UniqueBase<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode,_de::DefaultDeleter<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode>_>
    .m_data.ptr)->children).
  super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_008a5ba7:
  pSVar16 = sparseIndex.
            super_UniqueBase<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode,_de::DefaultDeleter<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode>_>
            .m_data.ptr;
  if (lVar12 == lVar14 / 0x48) {
    anon_unknown_8::normalizeSparseIndex
              (sparseIndex.
               super_UniqueBase<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode,_de::DefaultDeleter<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode>_>
               .m_data.ptr);
    dVar6 = anon_unknown_8::getIndexSize(pSVar16);
    if (dVar6 == 0) {
      std::
      vector<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
      ::resize(&index,1);
      (index.
       super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
       ._M_impl.super__Vector_impl_data._M_start)->word = 0;
      (index.
       super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
       ._M_impl.super__Vector_impl_data._M_start)->index = 0;
    }
    else {
      std::
      vector<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
      ::resize(&index,(ulong)dVar6);
      anon_unknown_8::addAndCountNodes
                (index.
                 super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
                 ._M_impl.super__Vector_impl_data._M_start,0,pSVar16);
    }
    de::details::
    UniqueBase<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode,_de::DefaultDeleter<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode>_>
    ::~UniqueBase(&sparseIndex.
                   super_UniqueBase<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode,_de::DefaultDeleter<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode>_>
                 );
    de::FilePath::getDirName_abi_cxx11_((string *)&sparseIndex,&filePath);
    std::__cxx11::string::string((string *)&out,(string *)&sparseIndex);
    bVar4 = de::FilePath::exists((FilePath *)&out);
    std::__cxx11::string::~string((string *)&out);
    std::__cxx11::string::~string((string *)&sparseIndex);
    if (!bVar4) {
      de::FilePath::getDirName_abi_cxx11_((string *)&out,&filePath);
      de::createDirectoryAndParents(_out);
      std::__cxx11::string::~string((string *)&out);
    }
    std::ofstream::ofstream(&out,filePath.m_path._M_dataplus._M_p,_S_bin);
    cVar5 = std::__basic_file<char>::is_open();
    if ((cVar5 != '\0') && (*(int *)((long)aiStack_210 + *(long *)(_out + -0x18)) == 0)) {
      std::ostream::write((char *)&out,
                          (long)index.
                                super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
                                ._M_impl.super__Vector_impl_data._M_start);
      std::ofstream::~ofstream(&out);
      std::
      _Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
      ::~_Vector_base(&index.
                       super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
                     );
      std::__cxx11::string::~string((string *)&filePath);
      return;
    }
    this_01 = (InternalError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"Failed to open program binary index file ",&local_2c9);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sparseIndex
                   ,&local_270,filePath.m_path._M_dataplus._M_p);
    tcu::InternalError::InternalError(this_01,(string *)&sparseIndex);
    __cxa_throw(this_01,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  }
  pPVar15 = (pointer)(local_2c0 + lVar12);
  anon_unknown_8::getSearchPath
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&out,
             (ProgramIdentifier *)pPVar15);
  uVar9 = (long)(local_228 - (long)_out) >> 2;
  dVar6 = pPVar15->index;
  _Var11._M_p = _out;
  pSVar16 = sparseIndex.
            super_UniqueBase<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode,_de::DefaultDeleter<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode>_>
            .m_data.ptr;
  do {
    dVar1 = *(deUint32 *)_Var11._M_p;
    ppSVar3 = (pSVar16->children).
              super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar13 = (long)(pSVar16->children).
                   super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar3 >> 3;
    lVar10 = 0;
    do {
      if (lVar13 == lVar10) {
        std::
        vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
        ::reserve(&pSVar16->children,lVar13 + 1);
        local_270._M_dataplus._M_p = (pointer)operator_new(0x20);
        dVar7 = 0;
        if (uVar9 == 1) {
          dVar7 = dVar6;
        }
        *(deUint32 *)local_270._M_dataplus._M_p = dVar1;
        *(deUint32 *)((long)local_270._M_dataplus._M_p + 4) = dVar7;
        *(deUint32 *)((long)local_270._M_dataplus._M_p + 8) = 0;
        *(deUint32 *)((long)local_270._M_dataplus._M_p + 0xc) = 0;
        *(deUint32 *)((long)local_270._M_dataplus._M_p + 0x10) = 0;
        *(deUint32 *)((long)local_270._M_dataplus._M_p + 0x14) = 0;
        *(deUint32 *)((long)local_270._M_dataplus._M_p + 0x18) = 0;
        *(deUint32 *)((long)local_270._M_dataplus._M_p + 0x1c) = 0;
        std::
        vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
        ::push_back(&pSVar16->children,(value_type *)&local_270);
        pSVar8 = (pSVar16->children).
                 super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1];
        break;
      }
      pSVar8 = ppSVar3[lVar10];
      lVar10 = lVar10 + 1;
    } while (pSVar8->word != dVar1);
    if (uVar9 < 2) break;
    _Var11._M_p = _Var11._M_p + 4;
    uVar9 = uVar9 - 1;
    pSVar16 = pSVar8;
  } while( true );
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&out);
  lVar12 = lVar12 + 1;
  goto LAB_008a5ba7;
}

Assistant:

void BinaryRegistryWriter::writeToPath (const std::string& dstPath) const
{
	if (!de::FilePath(dstPath).exists())
		de::createDirectoryAndParents(dstPath.c_str());

	DE_ASSERT(m_binaries.size() <= 0xffffffffu);
	for (size_t binaryNdx = 0; binaryNdx < m_binaries.size(); ++binaryNdx)
	{
		const BinarySlot&	slot	= m_binaries[binaryNdx];

		if (slot.referenceCount > 0)
		{
			DE_ASSERT(slot.binary);
			writeBinary(dstPath, (deUint32)binaryNdx, *slot.binary);
		}
		else
		{
			// Delete stale binary if such exists
			const std::string	progPath	= getProgramPath(dstPath, (deUint32)binaryNdx);

			if (de::FilePath(progPath).exists())
				deDeleteFile(progPath.c_str());
		}

	}

	// Write index
	{
		const de::FilePath				indexPath	= getIndexPath(dstPath);
		std::vector<BinaryIndexNode>	index;

		buildBinaryIndex(&index, m_binaryIndices.size(), !m_binaryIndices.empty() ? &m_binaryIndices[0] : DE_NULL);

		// Even in empty index there is always terminating node for the root group
		DE_ASSERT(!index.empty());

		if (!de::FilePath(indexPath.getDirName()).exists())
			de::createDirectoryAndParents(indexPath.getDirName().c_str());

		{
			std::ofstream indexOut(indexPath.getPath(), std::ios_base::binary);

			if (!indexOut.is_open() || !indexOut.good())
				throw tcu::InternalError(string("Failed to open program binary index file ") + indexPath.getPath());

			indexOut.write((const char*)&index[0], index.size()*sizeof(BinaryIndexNode));
		}
	}
}